

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

expr * printreg(disctx *ctx,ull *a,ull *m,reg *reg)

{
  int iVar1;
  sreg *psVar2;
  ull uVar3;
  expr *peVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  
  if (reg->bf == (bitfield *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = getbf(reg->bf,a,m,ctx);
  }
  psVar2 = reg->specials;
  if (psVar2 != (sreg *)0x0) {
    iVar1 = psVar2->num;
    while (iVar1 != -1) {
      if (((psVar2->vartype == 0) || ((ctx->vartype & psVar2->vartype) != 0)) &&
         (uVar3 == (long)iVar1)) {
        switch(psVar2->mode) {
        case SR_NAMED:
          peVar4 = (expr *)calloc(0x48,1);
          peVar4->type = EXPR_REG;
          peVar4->str = psVar2->name;
          peVar4->special = 1;
          return peVar4;
        case SR_ZERO:
          return (expr *)0x0;
        case SR_ONE:
          peVar4 = (expr *)calloc(0x48,1);
          peVar4->num1 = 1;
          return peVar4;
        case SR_DISCARD:
          peVar4 = (expr *)calloc(0x48,1);
          peVar4->type = EXPR_DISCARD;
          return peVar4;
        }
      }
      iVar1 = psVar2[1].num;
      psVar2 = psVar2 + 1;
    }
  }
  peVar4 = (expr *)calloc(0x48,1);
  peVar4->type = EXPR_REG;
  pcVar6 = "";
  if (reg->suffix != (char *)0x0) {
    pcVar6 = reg->suffix;
  }
  pcVar5 = "h";
  if ((uVar3 & 1) == 0) {
    pcVar5 = "l";
  }
  iVar1 = reg->hilo;
  if (iVar1 == 0) {
    pcVar5 = pcVar6;
  }
  iVar7 = 2;
  if (reg->always_special == 0) {
    iVar7 = reg->cool;
  }
  peVar4->special = iVar7;
  if (reg->bf == (bitfield *)0x0) {
    pcVar6 = aprint("%s%s",reg->name,pcVar5);
  }
  else {
    pcVar6 = aprint("%s%lld%s",reg->name,uVar3 >> (iVar1 != 0),pcVar5);
  }
  peVar4->str = pcVar6;
  return peVar4;
}

Assistant:

static struct expr *printreg (struct disctx *ctx, ull *a, ull *m, const struct reg *reg) {
	struct expr *expr;
	ull num = 0;
	if (reg->bf)
		num = GETBF(reg->bf);
	if (reg->specials) {
		int i;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (reg->specials[i].vartype && !(reg->specials[i].vartype & ctx->vartype))
				continue;
			if (num == reg->specials[i].num) {
				switch (reg->specials[i].mode) {
					case SR_NAMED:
						expr = makeex(EXPR_REG);
						expr->str = reg->specials[i].name;
						expr->special = 1;
						return expr;
					case SR_ZERO:
						return 0;
					case SR_ONE:
						expr = makeex(EXPR_NUM);
						expr->num1 = 1;
						return expr;
					case SR_DISCARD:
						expr = makeex(EXPR_DISCARD);
						return expr;
				}
			}
		}
	}
	expr = makeex(EXPR_REG);
	const char *suf = "";
	if (reg->suffix)
		suf = reg->suffix;
	if (reg->hilo) {
		if (num & 1)
			suf = "h";
		else
			suf = "l";
		num >>= 1;
	}
	expr->special = reg->cool;
	if (reg->always_special)
		expr->special = 2;
	if (reg->bf)
		expr->str = aprint("%s%lld%s", reg->name, num, suf);
	else
		expr->str = aprint("%s%s", reg->name, suf);
	return expr;
}